

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCompilerRequirementFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pbVar1;
  undefined8 uVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  cmMakefile *pcVar8;
  size_type sVar9;
  reference pvVar10;
  ostream *poVar11;
  string *psVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  iterator iVar15;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  reference pbVar16;
  ulong local_ae8;
  size_t i_3;
  string local_ad8;
  undefined1 local_ab8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_3;
  char *opt_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  undefined1 local_a18 [8];
  string option_flag_3;
  size_t i_2;
  string local_9e8;
  undefined1 local_9c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_2;
  char *opt_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  undefined1 local_928 [8];
  string option_flag_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  undefined1 local_880 [8];
  string e_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_848;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_840;
  const_iterator defaultStdIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  undefined1 local_7d8 [8];
  string e_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_798;
  const_iterator stdIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stds;
  undefined1 local_780 [8];
  string standard;
  value_type local_758;
  allocator local_731;
  key_type local_730;
  allocator local_709;
  value_type local_708;
  allocator local_6e1;
  key_type local_6e0;
  allocator local_6b9;
  value_type local_6b8;
  allocator local_691;
  key_type local_690;
  allocator local_669;
  value_type local_668;
  allocator local_641;
  key_type local_640;
  allocator local_619;
  value_type local_618;
  allocator local_5f1;
  key_type local_5f0;
  allocator local_5c9;
  value_type local_5c8;
  allocator local_5a1;
  key_type local_5a0;
  allocator local_579;
  value_type local_578;
  allocator local_551;
  key_type local_550;
  allocator local_529;
  value_type local_528;
  allocator local_501;
  key_type local_500;
  allocator local_4d9;
  value_type local_4d8;
  allocator local_4b1;
  key_type local_4b0;
  allocator local_489;
  value_type local_488;
  allocator local_461;
  key_type local_460;
  ulong local_440;
  size_t i_1;
  string local_430;
  undefined1 local_410 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_1;
  undefined1 local_3d8 [8];
  ostringstream e;
  char *opt_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  string option_flag_1;
  allocator local_191;
  undefined1 local_190 [8];
  string type;
  ulong local_168;
  size_t i;
  string local_158;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  char *opt;
  undefined1 local_f8 [8];
  string option_flag;
  char *standardProp;
  string stdProp;
  char *extPropValue;
  undefined1 local_a0 [7];
  bool ext;
  string extProp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  char *defaultStd;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  defaultStd = (char *)lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pcVar8 = this->Makefile;
    std::operator+(&local_70,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultStd);
    std::operator+(&local_50,&local_70,"_STANDARD_DEFAULT");
    pcVar7 = cmMakefile::GetDefinition(pcVar8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      local_30 = pcVar7;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultStd
                     ,"_EXTENSIONS");
      extPropValue._7_1_ = true;
      stdProp.field_2._8_8_ =
           cmGeneratorTarget::GetProperty
                     ((cmGeneratorTarget *)lang_local,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0)
      ;
      if ((char *)stdProp.field_2._8_8_ != (char *)0x0) {
        bVar4 = cmSystemTools::IsOff((char *)stdProp.field_2._8_8_);
        extPropValue._7_1_ = !bVar4;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &standardProp,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultStd
                     ,"_STANDARD");
      option_flag.field_2._8_8_ =
           cmGeneratorTarget::GetProperty((cmGeneratorTarget *)lang_local,(string *)&standardProp);
      if ((char *)option_flag.field_2._8_8_ == (char *)0x0) {
        if (extPropValue._7_1_) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                         "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)defaultStd);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&opt,"_EXTENSION_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&opt);
          pcVar8 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
          optVec.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)cmMakefile::GetDefinition(pcVar8,(string *)local_f8);
          if (optVec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
            pbVar1 = optVec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_158,(char *)pbVar1,(allocator *)((long)&i + 7));
            cmSystemTools::ExpandListArgument
                      (&local_158,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138,false);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
            for (local_168 = 0;
                sVar9 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_138), pcVar3 = target_local, local_168 < sVar9;
                local_168 = local_168 + 1) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_138,local_168);
              (*this->_vptr_cmLocalGenerator[8])(this,pcVar3,pvVar10);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_138);
          }
          std::__cxx11::string::~string((string *)local_f8);
        }
        type.field_2._12_4_ = 1;
      }
      else {
        pcVar7 = "STANDARD";
        if (extPropValue._7_1_) {
          pcVar7 = "EXTENSION";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_190,pcVar7,&local_191);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        psVar12 = lang_local;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&option_flag_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       defaultStd,"_STANDARD_REQUIRED");
        bVar4 = cmGeneratorTarget::GetPropertyAsBool
                          ((cmGeneratorTarget *)psVar12,(string *)((long)&option_flag_1.field_2 + 8)
                          );
        std::__cxx11::string::~string((string *)(option_flag_1.field_2._M_local_buf + 8));
        if (bVar4) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt_1
                         ,"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         defaultStd);
          std::operator+(&local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt_1
                         ,(char *)option_flag.field_2._8_8_);
          std::operator+(&local_218,&local_238,"_");
          std::operator+(&local_1f8,&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,&local_1f8,"_COMPILE_OPTION");
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&opt_1);
          pcVar8 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
          pcVar7 = cmMakefile::GetDefinition(pcVar8,(string *)local_1d8);
          if (pcVar7 == (char *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            poVar11 = std::operator<<((ostream *)local_3d8,"Target \"");
            psVar12 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)lang_local);
            poVar11 = std::operator<<(poVar11,(string *)psVar12);
            poVar11 = std::operator<<(poVar11,"\" requires the language dialect \"");
            poVar11 = std::operator<<(poVar11,(string *)defaultStd);
            poVar11 = std::operator<<(poVar11,(char *)option_flag.field_2._8_8_);
            poVar11 = std::operator<<(poVar11,"\" ");
            pcVar7 = "";
            if (extPropValue._7_1_) {
              pcVar7 = "(with compiler extensions)";
            }
            poVar11 = std::operator<<(poVar11,pcVar7);
            std::operator<<(poVar11,
                            ", but CMake does not know the compile flags to use to enable it.");
            std::__cxx11::ostringstream::str();
            IssueMessage(this,FATAL_ERROR,
                         (string *)
                         &optVec_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &optVec_1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_410);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_430,pcVar7,(allocator *)((long)&i_1 + 7));
            cmSystemTools::ExpandListArgument
                      (&local_430,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_410,false);
            std::__cxx11::string::~string((string *)&local_430);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
            for (local_440 = 0; uVar6 = local_440,
                sVar9 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_410), pcVar3 = target_local, uVar6 < sVar9;
                local_440 = local_440 + 1) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_410,local_440);
              (*this->_vptr_cmLocalGenerator[8])(this,pcVar3,pvVar10);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_410);
          }
          type.field_2._12_4_ = 1;
          std::__cxx11::string::~string((string *)local_1d8);
        }
        else {
          if ((AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
               ::langStdMap_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                           ::langStdMap_abi_cxx11_), iVar5 != 0)) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::map(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                   ::langStdMap_abi_cxx11_);
            __cxa_atexit(std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::~map,&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                 ::langStdMap_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                 ::langStdMap_abi_cxx11_);
          }
          bVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::empty(&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                           ::langStdMap_abi_cxx11_);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_460,"CXX",&local_461);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_460);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_488,"17",&local_489);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_488);
            std::__cxx11::string::~string((string *)&local_488);
            std::allocator<char>::~allocator((allocator<char> *)&local_489);
            std::__cxx11::string::~string((string *)&local_460);
            std::allocator<char>::~allocator((allocator<char> *)&local_461);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4b0,"CXX",&local_4b1);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_4b0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4d8,"14",&local_4d9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_4d8);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_500,"CXX",&local_501);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_500);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_528,"11",&local_529);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_528);
            std::__cxx11::string::~string((string *)&local_528);
            std::allocator<char>::~allocator((allocator<char> *)&local_529);
            std::__cxx11::string::~string((string *)&local_500);
            std::allocator<char>::~allocator((allocator<char> *)&local_501);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_550,"CXX",&local_551);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_550);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_578,"98",&local_579);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_578);
            std::__cxx11::string::~string((string *)&local_578);
            std::allocator<char>::~allocator((allocator<char> *)&local_579);
            std::__cxx11::string::~string((string *)&local_550);
            std::allocator<char>::~allocator((allocator<char> *)&local_551);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5a0,"C",&local_5a1);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_5a0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5c8,"11",&local_5c9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_5c8);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_5f0,"C",&local_5f1);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_5f0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_618,"99",&local_619);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_618);
            std::__cxx11::string::~string((string *)&local_618);
            std::allocator<char>::~allocator((allocator<char> *)&local_619);
            std::__cxx11::string::~string((string *)&local_5f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_640,"C",&local_641);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_640);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_668,"90",&local_669);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_668);
            std::__cxx11::string::~string((string *)&local_668);
            std::allocator<char>::~allocator((allocator<char> *)&local_669);
            std::__cxx11::string::~string((string *)&local_640);
            std::allocator<char>::~allocator((allocator<char> *)&local_641);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_690,"CUDA",&local_691);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_690);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_6b8,"14",&local_6b9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_6b8);
            std::__cxx11::string::~string((string *)&local_6b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
            std::__cxx11::string::~string((string *)&local_690);
            std::allocator<char>::~allocator((allocator<char> *)&local_691);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_6e0,"CUDA",&local_6e1);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_6e0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_708,"11",&local_709);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_708);
            std::__cxx11::string::~string((string *)&local_708);
            std::allocator<char>::~allocator((allocator<char> *)&local_709);
            std::__cxx11::string::~string((string *)&local_6e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_730,"CUDA",&local_731);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                    ::langStdMap_abi_cxx11_,&local_730);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_758,"98",(allocator *)(standard.field_2._M_local_buf + 0xf))
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pmVar13,&local_758);
            std::__cxx11::string::~string((string *)&local_758);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(standard.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string((string *)&local_730);
            std::allocator<char>::~allocator((allocator<char> *)&local_731);
          }
          uVar2 = option_flag.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_780,(char *)uVar2,(allocator *)((long)&stds + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&stds + 7));
          stdIt._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                             ::langStdMap_abi_cxx11_,(key_type *)defaultStd);
          iVar14 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)stdIt._M_current);
          iVar15 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(stdIt._M_current);
          local_7a0 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (iVar14._M_current,iVar15._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_780);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_798,&local_7a0);
          e_1.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)stdIt._M_current);
          bVar4 = __gnu_cxx::operator==
                            (&local_798,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&e_1.field_2 + 8));
          if (bVar4) {
            std::operator+(&local_818,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           defaultStd,"_STANDARD is set to invalid value \'");
            std::operator+(&local_7f8,&local_818,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_780);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_7d8,&local_7f8,"\'");
            std::__cxx11::string::~string((string *)&local_7f8);
            std::__cxx11::string::~string((string *)&local_818);
            this_00 = GetGlobalGenerator(this);
            this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
            cmGeneratorTarget::GetBacktrace
                      ((cmListFileBacktrace *)&defaultStdIt,(cmGeneratorTarget *)lang_local);
            cmake::IssueMessage(this_01,FATAL_ERROR,(string *)local_7d8,
                                (cmListFileBacktrace *)&defaultStdIt);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&defaultStdIt);
            type.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)local_7d8);
          }
          else {
            iVar14 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(stdIt._M_current);
            iVar15 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(stdIt._M_current);
            local_848 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                                  (iVar14._M_current,iVar15._M_current,&local_30);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_840,&local_848);
            e_2.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)stdIt._M_current);
            bVar4 = __gnu_cxx::operator==
                              (&local_840,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&e_2.field_2 + 8));
            if (bVar4) {
              std::operator+(&local_8e0,"CMAKE_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             defaultStd);
              std::operator+(&local_8c0,&local_8e0,"_STANDARD_DEFAULT is set to invalid value \'");
              pcVar7 = local_30;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_900,pcVar7,
                         (allocator *)(option_flag_2.field_2._M_local_buf + 0xf));
              std::operator+(&local_8a0,&local_8c0,&local_900);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_880,&local_8a0,"\'");
              std::__cxx11::string::~string((string *)&local_8a0);
              std::__cxx11::string::~string((string *)&local_900);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(option_flag_2.field_2._M_local_buf + 0xf));
              std::__cxx11::string::~string((string *)&local_8c0);
              std::__cxx11::string::~string((string *)&local_8e0);
              IssueMessage(this,INTERNAL_ERROR,(string *)local_880);
              type.field_2._12_4_ = 1;
              std::__cxx11::string::~string((string *)local_880);
            }
            else {
              bVar4 = __gnu_cxx::operator>=(&local_798,&local_840);
              if (bVar4) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opt_2,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               defaultStd);
                pbVar16 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_798);
                std::operator+(&local_988,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &opt_2,pbVar16);
                std::operator+(&local_968,&local_988,"_");
                std::operator+(&local_948,&local_968,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_190);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_928,&local_948,"_COMPILE_OPTION");
                std::__cxx11::string::~string((string *)&local_948);
                std::__cxx11::string::~string((string *)&local_968);
                std::__cxx11::string::~string((string *)&local_988);
                std::__cxx11::string::~string((string *)&opt_2);
                pcVar8 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
                optVec_2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)cmMakefile::GetRequiredDefinition(pcVar8,(string *)local_928);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_9c8);
                pbVar1 = optVec_2.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_9e8,(char *)pbVar1,(allocator *)((long)&i_2 + 7));
                cmSystemTools::ExpandListArgument
                          (&local_9e8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_9c8,false);
                std::__cxx11::string::~string((string *)&local_9e8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 7));
                for (option_flag_3.field_2._8_8_ = 0; uVar2 = option_flag_3.field_2._8_8_,
                    sVar9 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_9c8), pcVar3 = target_local, (ulong)uVar2 < sVar9;
                    option_flag_3.field_2._8_8_ = option_flag_3.field_2._8_8_ + 1) {
                  pvVar10 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_9c8,option_flag_3.field_2._8_8_);
                  (*this->_vptr_cmLocalGenerator[8])(this,pcVar3,pvVar10);
                }
                type.field_2._12_4_ = 1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_9c8);
                std::__cxx11::string::~string((string *)local_928);
              }
              else {
                while (bVar4 = __gnu_cxx::operator<(&local_798,&local_840), bVar4) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&opt_3,"CMAKE_",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)defaultStd);
                  pbVar16 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&local_798);
                  std::operator+(&local_a78,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&opt_3,pbVar16);
                  std::operator+(&local_a58,&local_a78,"_");
                  std::operator+(&local_a38,&local_a58,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_190);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a18,&local_a38,"_COMPILE_OPTION");
                  std::__cxx11::string::~string((string *)&local_a38);
                  std::__cxx11::string::~string((string *)&local_a58);
                  std::__cxx11::string::~string((string *)&local_a78);
                  std::__cxx11::string::~string((string *)&opt_3);
                  pcVar8 = cmTarget::GetMakefile(*(cmTarget **)lang_local);
                  optVec_3.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)cmMakefile::GetDefinition(pcVar8,(string *)local_a18);
                  if (optVec_3.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                    type.field_2._12_4_ = 0;
                  }
                  else {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_ab8);
                    pbVar1 = optVec_3.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_ad8,(char *)pbVar1,(allocator *)((long)&i_3 + 7));
                    cmSystemTools::ExpandListArgument
                              (&local_ad8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_ab8,false);
                    std::__cxx11::string::~string((string *)&local_ad8);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
                    for (local_ae8 = 0;
                        sVar9 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_ab8), pcVar3 = target_local, local_ae8 < sVar9;
                        local_ae8 = local_ae8 + 1) {
                      pvVar10 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_ab8,local_ae8);
                      (*this->_vptr_cmLocalGenerator[8])(this,pcVar3,pvVar10);
                    }
                    type.field_2._12_4_ = 1;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_ab8);
                  }
                  std::__cxx11::string::~string((string *)local_a18);
                  if (type.field_2._12_4_ != 0) goto LAB_007339d0;
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_798);
                }
                type.field_2._12_4_ = 0;
              }
            }
          }
LAB_007339d0:
          std::__cxx11::string::~string((string *)local_780);
        }
        std::__cxx11::string::~string((string *)local_190);
      }
      std::__cxx11::string::~string((string *)&standardProp);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompilerRequirementFlag(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }
  const char* defaultStd =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_STANDARD_DEFAULT");
  if (!defaultStd || !*defaultStd) {
    // This compiler has no notion of language standard levels.
    return;
  }
  std::string extProp = lang + "_EXTENSIONS";
  bool ext = true;
  if (const char* extPropValue = target->GetProperty(extProp)) {
    if (cmSystemTools::IsOff(extPropValue)) {
      ext = false;
    }
  }
  std::string stdProp = lang + "_STANDARD";
  const char* standardProp = target->GetProperty(stdProp);
  if (!standardProp) {
    if (ext) {
      // No language standard is specified and extensions are not disabled.
      // Check if this compiler needs a flag to enable extensions.
      std::string const option_flag =
        "CMAKE_" + lang + "_EXTENSION_COMPILE_OPTION";
      if (const char* opt =
            target->Target->GetMakefile()->GetDefinition(option_flag)) {
        std::vector<std::string> optVec;
        cmSystemTools::ExpandListArgument(opt, optVec);
        for (size_t i = 0; i < optVec.size(); ++i) {
          this->AppendFlagEscape(flags, optVec[i]);
        }
      }
    }
    return;
  }

  std::string const type = ext ? "EXTENSION" : "STANDARD";

  if (target->GetPropertyAsBool(lang + "_STANDARD_REQUIRED")) {
    std::string option_flag =
      "CMAKE_" + lang + standardProp + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetDefinition(option_flag);
    if (!opt) {
      std::ostringstream e;
      e << "Target \"" << target->GetName() << "\" requires the language "
                                               "dialect \""
        << lang << standardProp << "\" "
        << (ext ? "(with compiler extensions)" : "")
        << ", but CMake "
           "does not know the compile flags to use to enable it.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
    } else {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (size_t i = 0; i < optVec.size(); ++i) {
        this->AppendFlagEscape(flags, optVec[i]);
      }
    }
    return;
  }

  static std::map<std::string, std::vector<std::string> > langStdMap;
  if (langStdMap.empty()) {
    // Maintain sorted order, most recent first.
    langStdMap["CXX"].push_back("17");
    langStdMap["CXX"].push_back("14");
    langStdMap["CXX"].push_back("11");
    langStdMap["CXX"].push_back("98");

    langStdMap["C"].push_back("11");
    langStdMap["C"].push_back("99");
    langStdMap["C"].push_back("90");

    langStdMap["CUDA"].push_back("14");
    langStdMap["CUDA"].push_back("11");
    langStdMap["CUDA"].push_back("98");
  }

  std::string standard(standardProp);

  std::vector<std::string>& stds = langStdMap[lang];

  std::vector<std::string>::const_iterator stdIt =
    std::find(stds.begin(), stds.end(), standard);
  if (stdIt == stds.end()) {
    std::string e =
      lang + "_STANDARD is set to invalid value '" + standard + "'";
    this->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, e, target->GetBacktrace());
    return;
  }

  std::vector<std::string>::const_iterator defaultStdIt =
    std::find(stds.begin(), stds.end(), defaultStd);
  if (defaultStdIt == stds.end()) {
    std::string e = "CMAKE_" + lang +
      "_STANDARD_DEFAULT is set to invalid value '" + std::string(defaultStd) +
      "'";
    this->IssueMessage(cmake::INTERNAL_ERROR, e);
    return;
  }

  // If the standard requested is older than the compiler's default
  // then we need to use a flag to change it.  The comparison is
  // greater-or-equal because the standards are stored in backward
  // chronological order.
  if (stdIt >= defaultStdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetRequiredDefinition(option_flag);
    std::vector<std::string> optVec;
    cmSystemTools::ExpandListArgument(opt, optVec);
    for (size_t i = 0; i < optVec.size(); ++i) {
      this->AppendFlagEscape(flags, optVec[i]);
    }
    return;
  }

  // The standard requested is at least as new as the compiler's default,
  // and the standard request is not required.  Decay to the newest standard
  // for which a flag is defined.
  for (; stdIt < defaultStdIt; ++stdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    if (const char* opt =
          target->Target->GetMakefile()->GetDefinition(option_flag)) {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (size_t i = 0; i < optVec.size(); ++i) {
        this->AppendFlagEscape(flags, optVec[i]);
      }
      return;
    }
  }
}